

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
msc::
mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
          (double param_1,vector<double,_std::allocator<double>_> *__return_storage_ptr__,msc *this,
          undefined8 *point,undefined8 *first,uint param_6)

{
  double *a;
  pointer pdVar1;
  pointer pdVar2;
  invalid_argument *this_00;
  long lVar3;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  it;
  double dVar4;
  allocator_type local_42;
  L2Sq local_41;
  double local_40;
  double local_38;
  
  local_40 = param_1;
  if (0 < (int)param_6) {
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,(ulong)param_6,&local_42);
    local_38 = 0.0;
    for (; point != first; point = point + 3) {
      a = (double *)*point;
      dVar4 = metrics::L2Sq::operator()(&local_41,a,(double *)this,param_6);
      dVar4 = (double)(-(ulong)(dVar4 * local_40 <= 1.0) & (ulong)(1.0 - dVar4 * local_40));
      pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (lVar3 = 0; (long)pdVar2 - (long)pdVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
        pdVar1[lVar3] = a[lVar3] * dVar4 + pdVar1[lVar3];
      }
      local_38 = local_38 + dVar4;
    }
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar3 = 0; (long)pdVar2 - (long)pdVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
      pdVar1[lVar3] = pdVar1[lVar3] / local_38;
    }
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline std::vector<T> mean_shift(const T* point,
    ForwardIterator first, ForwardIterator last, int dim,
    Metric metric, Kernel kernel, Estimator estimator)
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<ForwardIterator>::value_type C;

    std::vector<T> shifted(dim);
    const auto ibw = estimator(point, first, last, dim, metric);
    double total_weight = 0;

    for (auto it = first; it != last; it++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        const auto dist = metric(pt, point, dim);
        const auto weight = kernel(dist * ibw);
        for (std::size_t k = 0; k < shifted.size(); k++)
            shifted[k] += pt[k] * weight;
        total_weight += weight;
    }

    for (std::size_t k = 0; k < shifted.size(); k++)
        shifted[k] /= total_weight;

    return shifted;
}